

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O0

void __thiscall StatAggregator::printValues(StatAggregator *this,samples_t *values,string *unit)

{
  value_type vVar1;
  unsigned_long uVar2;
  ulong uVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  bool bVar5;
  uint uVar6;
  size_type sVar7;
  reference pvVar8;
  long lVar9;
  difference_type dVar10;
  reference puVar11;
  undefined8 uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar26;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar31;
  int bar_size;
  unsigned_long *h;
  iterator __end2_1;
  iterator __begin2_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2_1;
  int levels;
  size_t range;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  minmax;
  int distance;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> it
  ;
  uint64_t max_for_bin;
  uint bin;
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  int prev_distance;
  int nbins;
  Stats *stats_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<Stats,_std::allocator<Stats>_> *__range1_2;
  Stats *stats_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Stats,_std::allocator<Stats>_> *__range1_1;
  uint64_t spark_end;
  uint64_t spark_start;
  unsigned_long *d;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  double accum;
  double sum;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vec;
  Stats stats;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
  *t;
  iterator __end1;
  iterator __begin1;
  samples_t *__range1;
  vector<Stats,_std::allocator<Stats>_> value_stats;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffcb8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffcc0;
  unsigned_long *in_stack_fffffffffffffcc8;
  double dVar32;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 uVar33;
  undefined4 in_stack_fffffffffffffcdc;
  undefined4 uVar34;
  double local_2b0;
  double local_2a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_210;
  undefined1 *local_208;
  undefined4 local_1fc;
  ulong local_1f8;
  unsigned_long *local_1f0;
  unsigned_long *local_1e8;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_1e0;
  long local_1d0;
  unsigned_long *local_1c8;
  unsigned_long *local_1c0;
  int local_1b4;
  unsigned_long *local_1b0;
  unsigned_long *local_1a8;
  unsigned_long *local_1a0;
  long local_198;
  uint local_18c;
  undefined1 local_188 [24];
  int local_170;
  undefined4 local_16c;
  reference local_168;
  Stats *local_160;
  __normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_> local_158;
  undefined1 *local_150;
  reference local_148;
  Stats *local_140;
  __normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_> local_138;
  undefined1 *local_130;
  ulong local_128;
  unsigned_long local_120;
  reference local_118;
  unsigned_long *local_110;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_100;
  double local_f8;
  unsigned_long *local_f0;
  unsigned_long *local_e8;
  double local_e0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_c8;
  undefined4 local_ac;
  string local_a8 [32];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  reference local_50;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
  *local_48;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>_>
  local_40 [2];
  undefined1 local_30 [48];
  undefined4 uVar25;
  
  std::vector<Stats,_std::allocator<Stats>_>::vector
            ((vector<Stats,_std::allocator<Stats>_> *)0x18227c);
  local_40[0]._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
                   *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_48 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>
              *)std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
                ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
                       *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)), bVar5
        ) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>_>
               ::operator*(local_40);
    Stats::Stats((Stats *)0x1822f6);
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_50->second);
    if (sVar7 == 0) {
      local_ac = 3;
    }
    else {
      std::__cxx11::string::operator=(local_a8,(string *)local_50);
      local_58 = local_50->second;
      local_c8 = local_50->second;
      local_d0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_d8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      std::
      sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      pvVar4 = local_c8;
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_c8);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar4,(sVar7 * 0x32) / 100);
      pvVar4 = local_c8;
      vVar1 = *pvVar8;
      auVar14._8_4_ = (int)(vVar1 >> 0x20);
      auVar14._0_8_ = vVar1;
      auVar14._12_4_ = 0x45300000;
      local_80 = (auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_c8);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar4,(sVar7 * 5) / 100);
      pvVar4 = local_c8;
      vVar1 = *pvVar8;
      auVar15._8_4_ = (int)(vVar1 >> 0x20);
      auVar15._0_8_ = vVar1;
      auVar15._12_4_ = 0x45300000;
      local_70 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_c8);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar4,(sVar7 * 0x5f) / 100);
      pvVar4 = local_c8;
      vVar1 = *pvVar8;
      auVar16._8_4_ = (int)(vVar1 >> 0x20);
      auVar16._0_8_ = vVar1;
      auVar16._12_4_ = 0x45300000;
      local_68 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_c8);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar4,(sVar7 * 99) / 100);
      vVar1 = *pvVar8;
      auVar17._8_4_ = (int)(vVar1 >> 0x20);
      auVar17._0_8_ = vVar1;
      auVar17._12_4_ = 0x45300000;
      local_60 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0);
      local_e8 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_f0 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      dVar13 = std::
               accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,double>
                         (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                          (double)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      local_e0 = dVar13;
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_c8);
      auVar27._8_4_ = (int)(sVar7 >> 0x20);
      auVar27._0_8_ = sVar7;
      auVar27._12_4_ = 0x45300000;
      local_88 = dVar13 / ((auVar27._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0));
      local_f8 = 0.0;
      local_100 = local_c8;
      local_108._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_110 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      while (bVar5 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)),
            dVar13 = local_f8, bVar5) {
        local_118 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_108);
        uVar2 = *local_118;
        auVar30._8_4_ = (int)(uVar2 >> 0x20);
        auVar30._0_8_ = uVar2;
        auVar30._12_4_ = 0x45300000;
        dVar13 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        local_f8 = (dVar13 - local_88) * (dVar13 - local_88) + local_f8;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_108);
      }
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_c8);
      lVar9 = sVar7 - 1;
      auVar28._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar28._0_8_ = lVar9;
      auVar28._12_4_ = 0x45300000;
      local_78 = sqrt(dVar13 / ((auVar28._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)));
      std::vector<Stats,_std::allocator<Stats>_>::push_back
                ((vector<Stats,_std::allocator<Stats>_> *)in_stack_fffffffffffffcc0._M_current,
                 (value_type *)in_stack_fffffffffffffcb8._M_current);
      local_ac = 0;
    }
    Stats::~Stats((Stats *)0x1827c6);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>_>
    ::operator++(local_40);
  }
  local_120 = std::numeric_limits<unsigned_long>::max();
  local_128 = 0;
  local_130 = local_30;
  local_138._M_current =
       (Stats *)std::vector<Stats,_std::allocator<Stats>_>::begin
                          ((vector<Stats,_std::allocator<Stats>_> *)
                           CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_140 = (Stats *)std::vector<Stats,_std::allocator<Stats>_>::end
                                 ((vector<Stats,_std::allocator<Stats>_> *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                            (__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)), bVar5
        ) {
    local_148 = __gnu_cxx::__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_>::
                operator*(&local_138);
    uVar25 = (undefined4)(local_120 >> 0x20);
    auVar18._8_4_ = uVar25;
    auVar18._0_8_ = local_120;
    auVar18._12_4_ = 0x45300000;
    if ((auVar18._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)local_120) - 4503599627370496.0) <= local_148->pct5) {
      auVar19._8_4_ = uVar25;
      auVar19._0_8_ = local_120;
      auVar19._12_4_ = 0x45300000;
      local_2a8 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_120) - 4503599627370496.0);
    }
    else {
      local_2a8 = local_148->pct5;
    }
    local_120 = (long)local_2a8 |
                (long)(local_2a8 - 9.223372036854776e+18) & (long)local_2a8 >> 0x3f;
    uVar25 = (undefined4)(local_128 >> 0x20);
    auVar29._8_4_ = uVar25;
    auVar29._0_8_ = local_128;
    auVar29._12_4_ = 0x45300000;
    if (local_148->pct95 <=
        (auVar29._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)local_128) - 4503599627370496.0)) {
      auVar20._8_4_ = uVar25;
      auVar20._0_8_ = local_128;
      auVar20._12_4_ = 0x45300000;
      local_2b0 = (auVar20._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_128) - 4503599627370496.0);
    }
    else {
      local_2b0 = local_148->pct95;
    }
    local_128 = (long)local_2b0 |
                (long)(local_2b0 - 9.223372036854776e+18) & (long)local_2b0 >> 0x3f;
    __gnu_cxx::__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_>::operator++
              (&local_138);
  }
  printf("\n                                Percentile\n");
  printf("  %-16s Median     95th     99th  Std Dev  Histogram of samples\n\n","");
  local_150 = local_30;
  local_158._M_current =
       (Stats *)std::vector<Stats,_std::allocator<Stats>_>::begin
                          ((vector<Stats,_std::allocator<Stats>_> *)
                           CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  local_160 = (Stats *)std::vector<Stats,_std::allocator<Stats>_>::end
                                 ((vector<Stats,_std::allocator<Stats>_> *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  while( true ) {
    bVar5 = __gnu_cxx::operator!=
                      ((__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_> *)
                       CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                       (__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_> *)
                       CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    if (!bVar5) break;
    local_168 = __gnu_cxx::__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_>::
                operator*(&local_158);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                            (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    if (bVar5) {
      uVar12 = std::__cxx11::string::c_str();
      printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",local_168->median,local_168->pct95,
             local_168->pct99,local_168->stddev,uVar12);
    }
    else {
      bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                              (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8))
      ;
      if (bVar5) {
        uVar12 = std::__cxx11::string::c_str();
        printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",local_168->median / 1000.0,
               local_168->pct95 / 1000.0,local_168->pct99 / 1000.0,local_168->stddev / 1000.0,uVar12
              );
      }
      else {
        uVar12 = std::__cxx11::string::c_str();
        printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",local_168->median / 1000000.0,
               local_168->pct95 / 1000000.0,local_168->pct99 / 1000000.0,
               local_168->stddev / 1000000.0,uVar12);
      }
    }
    local_16c = 0x20;
    local_170 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x182c16);
    for (local_18c = 0; local_18c < 0x20; local_18c = local_18c + 1) {
      local_198 = (local_128 >> 5) * (ulong)local_18c;
      local_1a8 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_1b0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      __first._M_current._4_4_ = in_stack_fffffffffffffcdc;
      __first._M_current._0_4_ = in_stack_fffffffffffffcd8;
      __last._M_current._4_4_ = in_stack_fffffffffffffcd4;
      __last._M_current._0_4_ = in_stack_fffffffffffffcd0;
      local_1a0 = (unsigned_long *)
                  std::
                  lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                            (__first,__last,in_stack_fffffffffffffcc8);
      local_1c0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_1c8 = local_1a0;
      dVar10 = std::
               distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
      local_1b4 = (int)dVar10;
      local_1d0 = (long)(local_1b4 - local_170);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                 (value_type *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      local_170 = local_1b4;
    }
    local_1e8 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    local_1f0 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    pVar31 = std::
             minmax_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                       (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    local_1e0 = pVar31;
    puVar11 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&local_1e0.second);
    uVar2 = *puVar11;
    puVar11 = __gnu_cxx::
              __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator*(&local_1e0.first);
    local_1f8 = (uVar2 - *puVar11) + 1;
    local_1fc = 8;
    local_208 = local_188;
    local_210._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
      if (!bVar5) break;
      puVar11 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_210);
      uVar2 = *puVar11;
      puVar11 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_1e0.first);
      uVar3 = ((uVar2 - *puVar11) * 7 + 7) / local_1f8;
      putchar(-0x1e);
      putchar(-0x6a);
      putchar((int)uVar3 + -0x7f);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_210);
    }
    putchar(10);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffcc0._M_current);
    __gnu_cxx::__normal_iterator<Stats_*,_std::vector<Stats,_std::allocator<Stats>_>_>::operator++
              (&local_158);
  }
  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                          (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
  uVar2 = local_120;
  if (bVar5) {
    uVar12 = std::__cxx11::string::c_str();
    printf("%52s  %-14d %s %14d\n","",uVar2 & 0xffffffff,uVar12,local_128 & 0xffffffff);
  }
  else {
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                            (char *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
    uVar25 = (undefined4)local_120;
    uVar26 = (undefined4)(local_120 >> 0x20);
    if (bVar5) {
      uVar33 = 0x43300000;
      uVar34 = 0x45300000;
      auVar21._8_4_ = uVar26;
      auVar21._0_8_ = local_120;
      auVar21._12_4_ = 0x45300000;
      uVar12 = std::__cxx11::string::c_str();
      auVar22._8_4_ = (int)(local_128 >> 0x20);
      auVar22._0_8_ = local_128;
      auVar22._12_4_ = uVar34;
      printf("%52s  %-14d %s %14d\n","",
             (ulong)(uint)(int)(((auVar21._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0)) / 1000.0
                               ),uVar12,
             (ulong)(uint)(int)(((auVar22._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(uVar33,(int)local_128) - 4503599627370496.0)) /
                               1000.0));
    }
    else {
      uVar33 = 0x43300000;
      uVar34 = 0x45300000;
      auVar23._8_4_ = uVar26;
      auVar23._0_8_ = local_120;
      auVar23._12_4_ = 0x45300000;
      dVar13 = 4503599627370496.0;
      in_stack_fffffffffffffcc0._M_current = (unsigned_long *)0x4530000000000000;
      dVar32 = 1000000.0;
      uVar6 = (uint)(((auVar23._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar25) - 4503599627370496.0)) / 1000000.0);
      uVar12 = std::__cxx11::string::c_str();
      auVar24._8_4_ = (int)(local_128 >> 0x20);
      auVar24._0_8_ = local_128;
      auVar24._12_4_ = uVar34;
      printf("%52s  %-14d %s %14d\n","",(ulong)uVar6,uVar12,
             (ulong)(uint)(int)(((auVar24._8_8_ - (double)in_stack_fffffffffffffcc0._M_current) +
                                ((double)CONCAT44(uVar33,(int)local_128) - dVar13)) / dVar32));
    }
  }
  std::vector<Stats,_std::allocator<Stats>_>::~vector
            ((vector<Stats,_std::allocator<Stats>_> *)in_stack_fffffffffffffcc0._M_current);
  return;
}

Assistant:

void StatAggregator::printValues(samples_t values, std::string unit) {

    // First, calculate mean, median, standard deviation and percentiles
    // of each set of values, both for printing and to derive what the
    // range of the graphs should be.
    std::vector<Stats> value_stats;
    for (const auto& t : values) {
        Stats stats;
        if (t.second->size() == 0) {
            continue;
        }
        stats.name = t.first;
        stats.values = t.second;
        std::vector<uint64_t>& vec = *t.second;

        // Calculate latency percentiles
        std::sort(vec.begin(), vec.end());
        stats.median = vec[(vec.size() * 50) / 100];
        stats.pct5 = vec[(vec.size() * 5) / 100];
        stats.pct95 = vec[(vec.size() * 95) / 100];
        stats.pct99 = vec[(vec.size() * 99) / 100];

        const double sum = std::accumulate(vec.begin(), vec.end(), 0.0);
        stats.mean = sum / vec.size();
        double accum = 0.0;
        for (auto &d : vec) {
            accum += (d - stats.mean) * (d - stats.mean);
        }
        stats.stddev = sqrt(accum / (vec.size() - 1));

        value_stats.push_back(stats);
    }

    // From these find the start and end for the spark graphs which covers the
    // a "reasonable sample" of each value set. We define that as from the 5th
    // to the 95th percentile, so we ensure *all* sets have that range covered.
    uint64_t spark_start = std::numeric_limits<uint64_t>::max();
    uint64_t spark_end = 0;
    for (const auto& stats : value_stats) {
        spark_start = (stats.pct5 < spark_start) ? stats.pct5 : spark_start;
        spark_end = (stats.pct95 > spark_end) ? stats.pct95 : spark_end;
    }

    printf("\n                                Percentile\n");
    printf("  %-16s Median     95th     99th  Std Dev  "
            "Histogram of samples\n\n", "");
    // Finally, print out each set.
    for (const auto& stats : value_stats) {
        if (unit == "µs") {
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median, stats.pct95,
                    stats.pct99, stats.stddev);
        } else if (unit == "ms") {
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median/1e3, stats.pct95/1e3,
                    stats.pct99/1e3, stats.stddev/1e3);
        } else {    // unit == "s"
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median/1e6, stats.pct95/1e6,
                    stats.pct99/1e6, stats.stddev/1e6);
        }

        // Calculate and render Sparkline (requires UTF-8 terminal).
        const int nbins = 32;
        int prev_distance = 0;
        std::vector<size_t> histogram;
        for (unsigned int bin = 0; bin < nbins; bin++) {
            const uint64_t max_for_bin = (spark_end / nbins) * bin;
            auto it = std::lower_bound(stats.values->begin(),
                                       stats.values->end(),
                                       max_for_bin);
            const int distance = std::distance(stats.values->begin(), it);
            histogram.push_back(distance - prev_distance);
            prev_distance = distance;
        }

        const auto minmax = std::minmax_element(histogram.begin(),
                                                histogram.end());
        const size_t range = *minmax.second - *minmax.first + 1;
        const int levels = 8;
        for (const auto& h : histogram) {
            int bar_size = ((h - *minmax.first + 1) * (levels - 1)) / range;
            putchar('\xe2');
            putchar('\x96');
            putchar('\x81' + bar_size);
        }
        putchar('\n');
    }
    if (unit == "µs") {
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start), unit.c_str(), int(spark_end));
    } else if (unit == "ms") {
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start/1e3), unit.c_str(), int(spark_end/1e3));
    } else {    // unit == "s"
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start/1e6), unit.c_str(), int(spark_end/1e6));
    }
}